

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTruth.c
# Opt level: O0

void Map_TruthsCutOne(Map_Man_t *p,Map_Cut_t *pCut,uint *uTruth)

{
  int local_3c;
  Map_Node_t *pMStack_38;
  int i;
  Map_Cut_t *pTemp;
  uint uTruth2 [2];
  uint uTruth1 [2];
  uint *uTruth_local;
  Map_Cut_t *pCut_local;
  Map_Man_t *p_local;
  
  pMStack_38 = (Map_Node_t *)0x0;
  for (local_3c = 0; local_3c < pCut->nLeaves; local_3c = local_3c + 1) {
    pMStack_38 = (Map_Node_t *)pCut->ppLeaves[local_3c]->pCuts;
    *(char *)((long)&pMStack_38->p2 + 6) = '\x01';
    *(uint *)((long)&pMStack_38->pRepr + 4) = p->uTruths[local_3c][0];
    pMStack_38->tRequired[1].Rise = (float)p->uTruths[local_3c][1];
  }
  if (pCut->fMark == '\0') {
    p->vVisited->nSize = 0;
    Map_CutsCollect_rec(pCut,p->vVisited);
    if (0 < p->vVisited->nSize) {
      pCut->nVolume = (char)p->vVisited->nSize;
      for (local_3c = 0; local_3c < pCut->nLeaves; local_3c = local_3c + 1) {
        pMStack_38 = (Map_Node_t *)pCut->ppLeaves[local_3c]->pCuts;
        *(char *)((long)&pMStack_38->p2 + 6) = '\0';
      }
      for (local_3c = 0; local_3c < p->vVisited->nSize; local_3c = local_3c + 1) {
        pMStack_38 = p->vVisited->pArray[local_3c];
        *(char *)((long)&pMStack_38->p2 + 6) = '\0';
        if (((ulong)pMStack_38->pNext & 1) == 0) {
          uTruth2[0] = *(uint *)(((ulong)pMStack_38->pNext & 0xfffffffffffffffe) + 0x5c);
          uTruth2[1] = *(uint *)(((ulong)pMStack_38->pNext & 0xfffffffffffffffe) + 0x84);
        }
        else {
          uTruth2[0] = *(uint *)(((ulong)pMStack_38->pNext & 0xfffffffffffffffe) + 0x5c) ^
                       0xffffffff;
          uTruth2[1] = *(uint *)(((ulong)pMStack_38->pNext & 0xfffffffffffffffe) + 0x84) ^
                       0xffffffff;
        }
        if (((ulong)*(Map_Cut_t **)&pMStack_38->Num & 1) == 0) {
          pTemp._0_4_ = *(uint *)(((ulong)*(Map_Cut_t **)&pMStack_38->Num & 0xfffffffffffffffe) +
                                 0x5c);
          pTemp._4_4_ = *(uint *)(((ulong)*(Map_Cut_t **)&pMStack_38->Num & 0xfffffffffffffffe) +
                                 0x84);
        }
        else {
          pTemp._0_4_ = *(uint *)(((ulong)*(Map_Cut_t **)&pMStack_38->Num & 0xfffffffffffffffe) +
                                 0x5c) ^ 0xffffffff;
          pTemp._4_4_ = *(uint *)(((ulong)*(Map_Cut_t **)&pMStack_38->Num & 0xfffffffffffffffe) +
                                 0x84) ^ 0xffffffff;
        }
        if (*(char *)((long)&pMStack_38->p2 + 7) == '\0') {
          *(uint *)((long)&pMStack_38->pRepr + 4) = uTruth2[0] & (uint)pTemp;
          pMStack_38->tRequired[1].Rise = (float)(uTruth2[1] & pTemp._4_4_);
        }
        else {
          *(uint *)((long)&pMStack_38->pRepr + 4) = uTruth2[0] & (uint)pTemp ^ 0xffffffff;
          pMStack_38->tRequired[1].Rise = (float)(uTruth2[1] & pTemp._4_4_ ^ 0xffffffff);
        }
      }
      *uTruth = *(uint *)((long)&pMStack_38->pRepr + 4);
      uTruth[1] = (uint)pMStack_38->tRequired[1].Rise;
      return;
    }
    __assert_fail("p->vVisited->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTruth.c"
                  ,0xd7,"void Map_TruthsCutOne(Map_Man_t *, Map_Cut_t *, unsigned int *)");
  }
  __assert_fail("pCut->fMark == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTruth.c"
                ,0xd2,"void Map_TruthsCutOne(Map_Man_t *, Map_Cut_t *, unsigned int *)");
}

Assistant:

void Map_TruthsCutOne( Map_Man_t * p, Map_Cut_t * pCut, unsigned uTruth[] )
{
    unsigned uTruth1[2], uTruth2[2];
    Map_Cut_t * pTemp = NULL; // Suppress "might be used uninitialized"
    int i;
    // mark the cut leaves
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pTemp = pCut->ppLeaves[i]->pCuts;
        pTemp->fMark = 1;
        pTemp->M[0].uPhaseBest = p->uTruths[i][0];
        pTemp->M[1].uPhaseBest = p->uTruths[i][1];
    }
    assert( pCut->fMark == 0 );

    // collect the cuts in the cut cone
    p->vVisited->nSize = 0;
    Map_CutsCollect_rec( pCut, p->vVisited );
    assert( p->vVisited->nSize > 0 );
    pCut->nVolume = p->vVisited->nSize;

    // compute the tables and unmark
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pTemp = pCut->ppLeaves[i]->pCuts;
        pTemp->fMark = 0;
    }
    for ( i = 0; i < p->vVisited->nSize; i++ )
    {
        // get the cut
        pTemp = (Map_Cut_t *)p->vVisited->pArray[i];
        pTemp->fMark = 0;
        // get truth table of the first branch
        if ( Map_CutIsComplement(pTemp->pOne) )
        {
            uTruth1[0] = ~Map_CutRegular(pTemp->pOne)->M[0].uPhaseBest;
            uTruth1[1] = ~Map_CutRegular(pTemp->pOne)->M[1].uPhaseBest;
        }
        else
        {
            uTruth1[0] = Map_CutRegular(pTemp->pOne)->M[0].uPhaseBest;
            uTruth1[1] = Map_CutRegular(pTemp->pOne)->M[1].uPhaseBest;
        }
        // get truth table of the second branch
        if ( Map_CutIsComplement(pTemp->pTwo) )
        {
            uTruth2[0] = ~Map_CutRegular(pTemp->pTwo)->M[0].uPhaseBest;
            uTruth2[1] = ~Map_CutRegular(pTemp->pTwo)->M[1].uPhaseBest;
        }
        else
        {
            uTruth2[0] = Map_CutRegular(pTemp->pTwo)->M[0].uPhaseBest;
            uTruth2[1] = Map_CutRegular(pTemp->pTwo)->M[1].uPhaseBest;
        }
        // get the truth table of the output
        if ( !pTemp->Phase )
        {
            pTemp->M[0].uPhaseBest = uTruth1[0] & uTruth2[0];
            pTemp->M[1].uPhaseBest = uTruth1[1] & uTruth2[1];
        }
        else
        {
            pTemp->M[0].uPhaseBest = ~(uTruth1[0] & uTruth2[0]);
            pTemp->M[1].uPhaseBest = ~(uTruth1[1] & uTruth2[1]);
        }
    }
    uTruth[0] = pTemp->M[0].uPhaseBest;
    uTruth[1] = pTemp->M[1].uPhaseBest;
}